

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O3

double S2::GetCurvature(S2PointLoopSpan loop)

{
  double dVar1;
  int i;
  S2PointLoopSpan loop_00;
  int iVar2;
  LoopOrder LVar3;
  reference pVVar4;
  reference pVVar5;
  reference pVVar6;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *in_RCX;
  int iVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  S2PointLoopSpan loop_01;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  size_type in_stack_ffffffffffffff90;
  S2PointSpan local_60;
  double local_50;
  void *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  loop_01.super_S2PointSpan.ptr_ = (pointer)loop.super_S2PointSpan.len_;
  if (loop_01.super_S2PointSpan.ptr_ == (pointer)0x0) {
    dVar10 = -6.283185307179586;
  }
  else {
    local_48 = (void *)0x0;
    uStack_40 = 0;
    local_38 = 0;
    loop_01.super_S2PointSpan.len_ = (size_type)&local_48;
    local_60 = loop.super_S2PointSpan;
    local_60 = (S2PointSpan)PruneDegeneracies((S2 *)loop.super_S2PointSpan.ptr_,loop_01,in_RCX);
    if (local_60.len_ == 0) {
      dVar10 = 6.283185307179586;
    }
    else {
      loop_00.super_S2PointSpan.ptr_._4_4_ = in_stack_ffffffffffffff8c;
      loop_00.super_S2PointSpan.ptr_._0_4_ = in_stack_ffffffffffffff88;
      loop_00.super_S2PointSpan.len_ = in_stack_ffffffffffffff90;
      LVar3 = GetCanonicalLoopOrder(loop_00);
      iVar7 = (int)local_60.len_;
      iVar2 = LVar3.first;
      iVar8 = LVar3.dir;
      pVVar4 = S2PointLoopSpan::operator[]
                         ((S2PointLoopSpan *)&local_60,
                          ((iVar2 - iVar8) + (int)local_60.len_) % (int)local_60.len_);
      pVVar5 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&local_60,iVar2);
      pVVar6 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&local_60,(iVar2 + iVar8) % iVar7);
      dVar10 = TurnAngle(pVVar4,pVVar5,pVVar6);
      dVar9 = 0.0;
      if (1 < iVar7) {
        iVar7 = iVar7 + 1;
        iVar2 = iVar8 * 2;
        do {
          i = LVar3.first;
          LVar3.first = i + iVar8;
          LVar3.dir = 0;
          local_50 = dVar10;
          pVVar4 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&local_60,i);
          pVVar5 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&local_60,LVar3.first);
          pVVar6 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)&local_60,i + iVar2);
          dVar1 = TurnAngle(pVVar4,pVVar5,pVVar6);
          dVar10 = local_50 + dVar9 + dVar1;
          dVar9 = dVar9 + dVar1 + (local_50 - dVar10);
          iVar7 = iVar7 + -1;
        } while (2 < iVar7);
      }
      dVar10 = (double)iVar8 * (dVar10 + dVar9);
      if (6.283185307179585 <= dVar10) {
        dVar10 = 6.283185307179585;
      }
      if (dVar10 <= -6.283185307179585) {
        dVar10 = -6.283185307179585;
      }
    }
    if (local_48 != (void *)0x0) {
      operator_delete(local_48);
    }
  }
  return dVar10;
}

Assistant:

double GetCurvature(S2PointLoopSpan loop) {
  // By convention, a loop with no vertices contains all points on the sphere.
  if (loop.empty()) return -2 * M_PI;

  // Remove any degeneracies from the loop.
  vector<S2Point> vertices;
  loop = PruneDegeneracies(loop, &vertices);

  // If the entire loop was degenerate, it's turning angle is defined as 2*Pi.
  if (loop.empty()) return 2 * M_PI;

  // To ensure that we get the same result when the vertex order is rotated,
  // and that the result is negated when the vertex order is reversed, we need
  // to add up the individual turn angles in a consistent order.  (In general,
  // adding up a set of numbers in a different order can change the sum due to
  // rounding errors.)
  //
  // Furthermore, if we just accumulate an ordinary sum then the worst-case
  // error is quadratic in the number of vertices.  (This can happen with
  // spiral shapes, where the partial sum of the turning angles can be linear
  // in the number of vertices.)  To avoid this we use the Kahan summation
  // algorithm (http://en.wikipedia.org/wiki/Kahan_summation_algorithm).
  LoopOrder order = GetCanonicalLoopOrder(loop);
  int i = order.first, dir = order.dir, n = loop.size();
  double sum = S2::TurnAngle(loop[(i + n - dir) % n], loop[i],
                             loop[(i + dir) % n]);
  double compensation = 0;  // Kahan summation algorithm
  while (--n > 0) {
    i += dir;
    double angle = S2::TurnAngle(loop[i - dir], loop[i], loop[i + dir]);
    double old_sum = sum;
    angle += compensation;
    sum += angle;
    compensation = (old_sum - sum) + angle;
  }
  constexpr double kMaxCurvature = 2 * M_PI - 4 * DBL_EPSILON;
  sum += compensation;
  return max(-kMaxCurvature, min(kMaxCurvature, dir * sum));
}